

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

bool duckdb::IsForeignKeyConstraintError(bool is_append,idx_t input_count,ManagedSelection *matches)

{
  idx_t iVar1;
  undefined3 in_register_00000039;
  
  iVar1 = 0;
  if (CONCAT31(in_register_00000039,is_append) != 0) {
    iVar1 = input_count;
  }
  return matches->count != iVar1;
}

Assistant:

bool IsForeignKeyConstraintError(bool is_append, idx_t input_count, const ManagedSelection &matches) {
	if (is_append) {
		// We need to find a match for all values
		return matches.Count() != input_count;
	} else {
		// We should not find any matches
		return matches.Count() != 0;
	}
}